

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O1

c_int osqp_cleanup(OSQPWorkspace *work)

{
  csc *pcVar1;
  c_float *pcVar2;
  LinSysSolver *pLVar3;
  c_int *pcVar4;
  c_int cVar5;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar5 = 0;
  }
  else {
    if (work->data != (OSQPData *)0x0) {
      pcVar1 = work->data->P;
      if (pcVar1 != (csc *)0x0) {
        csc_spfree(pcVar1);
      }
      pcVar1 = work->data->A;
      if (pcVar1 != (csc *)0x0) {
        csc_spfree(pcVar1);
      }
      pcVar2 = work->data->q;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      pcVar2 = work->data->l;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      pcVar2 = work->data->u;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      free(work->data);
    }
    if (work->scaling != (OSQPScaling *)0x0) {
      pcVar2 = work->scaling->D;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      pcVar2 = work->scaling->Dinv;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      pcVar2 = work->scaling->E;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      pcVar2 = work->scaling->Einv;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      free(work->scaling);
    }
    if (work->D_temp != (c_float *)0x0) {
      free(work->D_temp);
    }
    if (work->D_temp_A != (c_float *)0x0) {
      free(work->D_temp_A);
    }
    if (work->E_temp != (c_float *)0x0) {
      free(work->E_temp);
    }
    pLVar3 = work->linsys_solver;
    if ((pLVar3 != (LinSysSolver *)0x0) && (pLVar3->free != (_func_void_LinSysSolver_ptr *)0x0)) {
      (*pLVar3->free)(pLVar3);
    }
    if (work->settings == (OSQPSettings *)0x0) {
      cVar5 = 0;
    }
    else {
      cVar5 = unload_linsys_solver(work->settings->linsys_solver);
    }
    if (work->pol != (OSQPPolish *)0x0) {
      pcVar4 = work->pol->Alow_to_A;
      if (pcVar4 != (c_int *)0x0) {
        free(pcVar4);
      }
      pcVar4 = work->pol->Aupp_to_A;
      if (pcVar4 != (c_int *)0x0) {
        free(pcVar4);
      }
      pcVar4 = work->pol->A_to_Alow;
      if (pcVar4 != (c_int *)0x0) {
        free(pcVar4);
      }
      pcVar4 = work->pol->A_to_Aupp;
      if (pcVar4 != (c_int *)0x0) {
        free(pcVar4);
      }
      pcVar2 = work->pol->x;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      pcVar2 = work->pol->z;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      pcVar2 = work->pol->y;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      free(work->pol);
    }
    if (work->rho_vec != (c_float *)0x0) {
      free(work->rho_vec);
    }
    if (work->rho_inv_vec != (c_float *)0x0) {
      free(work->rho_inv_vec);
    }
    if (work->constr_type != (c_int *)0x0) {
      free(work->constr_type);
    }
    if (work->x != (c_float *)0x0) {
      free(work->x);
    }
    if (work->z != (c_float *)0x0) {
      free(work->z);
    }
    if (work->xz_tilde != (c_float *)0x0) {
      free(work->xz_tilde);
    }
    if (work->x_prev != (c_float *)0x0) {
      free(work->x_prev);
    }
    if (work->z_prev != (c_float *)0x0) {
      free(work->z_prev);
    }
    if (work->y != (c_float *)0x0) {
      free(work->y);
    }
    if (work->Ax != (c_float *)0x0) {
      free(work->Ax);
    }
    if (work->Px != (c_float *)0x0) {
      free(work->Px);
    }
    if (work->Aty != (c_float *)0x0) {
      free(work->Aty);
    }
    if (work->delta_y != (c_float *)0x0) {
      free(work->delta_y);
    }
    if (work->Atdelta_y != (c_float *)0x0) {
      free(work->Atdelta_y);
    }
    if (work->delta_x != (c_float *)0x0) {
      free(work->delta_x);
    }
    if (work->Pdelta_x != (c_float *)0x0) {
      free(work->Pdelta_x);
    }
    if (work->Adelta_x != (c_float *)0x0) {
      free(work->Adelta_x);
    }
    if (work->settings != (OSQPSettings *)0x0) {
      free(work->settings);
    }
    if (work->solution != (OSQPSolution *)0x0) {
      pcVar2 = work->solution->x;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      pcVar2 = work->solution->y;
      if (pcVar2 != (c_float *)0x0) {
        free(pcVar2);
      }
      free(work->solution);
    }
    if (work->info != (OSQPInfo *)0x0) {
      free(work->info);
    }
    if (work->timer != (OSQPTimer *)0x0) {
      free(work->timer);
    }
    free(work);
  }
  return cVar5;
}

Assistant:

c_int osqp_cleanup(OSQPWorkspace *work) {
  c_int exitflag = 0;

  if (work) { // If workspace has been allocated
    // Free Data
    if (work->data) {
      if (work->data->P) csc_spfree(work->data->P);
      if (work->data->A) csc_spfree(work->data->A);
      if (work->data->q) c_free(work->data->q);
      if (work->data->l) c_free(work->data->l);
      if (work->data->u) c_free(work->data->u);
      c_free(work->data);
    }

    // Free scaling variables
    if (work->scaling){
      if (work->scaling->D)    c_free(work->scaling->D);
      if (work->scaling->Dinv) c_free(work->scaling->Dinv);
      if (work->scaling->E)    c_free(work->scaling->E);
      if (work->scaling->Einv) c_free(work->scaling->Einv);
      c_free(work->scaling);
    }

    // Free temp workspace variables for scaling
    if (work->D_temp)   c_free(work->D_temp);
    if (work->D_temp_A) c_free(work->D_temp_A);
    if (work->E_temp)   c_free(work->E_temp);

    // Free linear system solver structure
    if (work->linsys_solver) {
      if (work->linsys_solver->free) {
        work->linsys_solver->free(work->linsys_solver);
      }
    }

    // Unload linear system solver after free
    if (work->settings) {
      exitflag = unload_linsys_solver(work->settings->linsys_solver);
    }

#ifndef EMBEDDED
    // Free active constraints structure
    if (work->pol) {
      if (work->pol->Alow_to_A) c_free(work->pol->Alow_to_A);
      if (work->pol->Aupp_to_A) c_free(work->pol->Aupp_to_A);
      if (work->pol->A_to_Alow) c_free(work->pol->A_to_Alow);
      if (work->pol->A_to_Aupp) c_free(work->pol->A_to_Aupp);
      if (work->pol->x)         c_free(work->pol->x);
      if (work->pol->z)         c_free(work->pol->z);
      if (work->pol->y)         c_free(work->pol->y);
      c_free(work->pol);
    }
#endif /* ifndef EMBEDDED */

    // Free other Variables
    if (work->rho_vec)     c_free(work->rho_vec);
    if (work->rho_inv_vec) c_free(work->rho_inv_vec);
#if EMBEDDED != 1
    if (work->constr_type) c_free(work->constr_type);
#endif
    if (work->x)           c_free(work->x);
    if (work->z)           c_free(work->z);
    if (work->xz_tilde)    c_free(work->xz_tilde);
    if (work->x_prev)      c_free(work->x_prev);
    if (work->z_prev)      c_free(work->z_prev);
    if (work->y)           c_free(work->y);
    if (work->Ax)          c_free(work->Ax);
    if (work->Px)          c_free(work->Px);
    if (work->Aty)         c_free(work->Aty);
    if (work->delta_y)     c_free(work->delta_y);
    if (work->Atdelta_y)   c_free(work->Atdelta_y);
    if (work->delta_x)     c_free(work->delta_x);
    if (work->Pdelta_x)    c_free(work->Pdelta_x);
    if (work->Adelta_x)    c_free(work->Adelta_x);

    // Free Settings
    if (work->settings) c_free(work->settings);

    // Free solution
    if (work->solution) {
      if (work->solution->x) c_free(work->solution->x);
      if (work->solution->y) c_free(work->solution->y);
      c_free(work->solution);
    }

    // Free information
    if (work->info) c_free(work->info);

# ifdef PROFILING
    // Free timer
    if (work->timer) c_free(work->timer);
# endif /* ifdef PROFILING */

    // Free work
    c_free(work);
  }

  return exitflag;
}